

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distributions.cpp
# Opt level: O0

double f_gaussian(double *rij,double *coeff,double *sq_ete,double *temp,double *gradi,double *gradj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double p;
  double rsq;
  double *gradj_local;
  double *gradi_local;
  double *temp_local;
  double *sq_ete_local;
  double *coeff_local;
  double *rij_local;
  
  dVar1 = *rij;
  dVar2 = *rij;
  dVar3 = rij[1];
  dVar4 = rij[1];
  dVar5 = rij[2];
  dVar6 = rij[2];
  dVar7 = (*coeff * *temp) / *sq_ete;
  *gradi = dVar7 * 2.0 * *rij;
  gradi[1] = dVar7 * 2.0 * rij[1];
  gradi[2] = dVar7 * 2.0 * rij[2];
  *gradj = -*gradi;
  gradj[1] = -gradi[1];
  gradj[2] = -gradi[2];
  return dVar7 * (dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4);
}

Assistant:

double f_gaussian(const double *rij, const double & coeff, const double & sq_ete, 
              const double & temp, double *gradi, double *gradj) {

   /** This routine applies a Gaussian free energy potential of the form:
    *  @f[ \mathcal{V}_{\rm b} \left(r^2_{ij} \right) = \epsilon_{\rm b} T 
    *  \frac{r^2_{ij}}{\sigma^2_{\rm b}}
    *  = \frac{3}{2}k_{\rm B}T\frac{\mathbf{R}_{ij} \cdot \mathbf{R}_{ij}}
    *  {n_{\rm Kuhns/bead} b^2} @f]
    * with the parameters @f$ \epsilon_{\rm b} @f$ and @f$ \sigma_{\rm b} @f$ read from the 
    * data file. In our approach @f$ \epsilon_{\rm b} = 0.012471 @f$  kJ/mol/K and 
    * @f$ \sigma_{\rm b} = 810 \; \text{\AA}^2 @f$ for polyisoprene melt.
    */
   
   // Compute the distance between positional vectors ri and rj
   double rsq = rij[0]*rij[0] + rij[1]*rij[1] + rij[2]*rij[2];

   // Compute the free energy of the Gaussian spring.
   double p = coeff * temp / sq_ete;

   // Compute the forces as gradients of the Gaussian distribution along ri and rj direction.
   gradi[0] = 2.0 * p * rij[0];
   gradi[1] = 2.0 * p * rij[1];
   gradi[2] = 2.0 * p * rij[2];

   gradj[0] = -gradi[0];
   gradj[1] = -gradi[1];
   gradj[2] = -gradi[2];
      
   return (p*rsq);
}